

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O3

void once_init(void)

{
  __shared_ptr<AsyncLogging,_(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  AsyncLogging *this_00;
  bool bVar3;
  string local_58;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  this_00 = (AsyncLogging *)operator_new(0x1e8);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,Logger::logFileName__abi_cxx11_._M_dataplus._M_p,
             Logger::logFileName__abi_cxx11_._M_dataplus._M_p +
             Logger::logFileName__abi_cxx11_._M_string_length);
  AsyncLogging::AsyncLogging(this_00,&local_58,2);
  local_38 = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<AsyncLogging*>(&_Stack_30,this_00)
  ;
  _Var1._M_refcount._M_pi = _Stack_30._M_pi;
  _Var1._M_ptr = local_38;
  local_38 = (element_type *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this._M_pi = AsyncLogger_.super___shared_ptr<AsyncLogging,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
  bVar3 = AsyncLogger_.super___shared_ptr<AsyncLogging,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AsyncLogger_.super___shared_ptr<AsyncLogging,_(__gnu_cxx::_Lock_policy)2> = _Var1;
  if (bVar3) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  peVar2 = AsyncLogger_.super___shared_ptr<AsyncLogging,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (AsyncLogger_.super___shared_ptr<AsyncLogging,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->running_ =
       true;
  Thread::start(&peVar2->thread_);
  CountDownLatch::wait(&peVar2->latch_,this_00);
  return;
}

Assistant:

void once_init() {
    AsyncLogger_ = std::shared_ptr<AsyncLogging>(new AsyncLogging(Logger::getLogFileName()));
    AsyncLogger_->start();
}